

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

char capnp::(anonymous_namespace)::checkRoundTripFromFloat<signed_char,double>(double value)

{
  bool bVar1;
  Fault local_f8;
  Fault f_2;
  DebugExpression<double> local_e8;
  undefined1 local_e0 [8];
  DebugComparison<double,_double_&> _kjCondition_2;
  char result;
  Fault f_1;
  double *local_a0;
  undefined1 local_98 [8];
  DebugComparison<double_&,_double> _kjCondition_1;
  Fault local_60;
  Fault f;
  double *local_50;
  undefined1 local_48 [8];
  DebugComparison<double_&,_double> _kjCondition;
  char MAX;
  double dStack_18;
  char MIN;
  double value_local;
  
  _kjCondition._39_1_ = 0x80;
  _kjCondition._38_1_ = 0x7f;
  dStack_18 = value;
  local_50 = (double *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffffe8);
  f.exception = (Exception *)0xc060000000000000;
  kj::_::DebugExpression<double&>::operator>=
            ((DebugComparison<double_&,_double> *)local_48,(DebugExpression<double&> *)&local_50,
             (double *)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (bVar1) {
    local_a0 = (double *)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffffe8);
    f_1.exception = (Exception *)0x405fc00000000000;
    kj::_::DebugExpression<double&>::operator<=
              ((DebugComparison<double_&,_double> *)local_98,(DebugExpression<double&> *)&local_a0,
               (double *)&f_1);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
    if (bVar1) {
      _kjCondition_2._39_1_ = SUB41((int)dStack_18,0);
      f_2.exception = (Exception *)(double)(int)(char)_kjCondition_2._39_1_;
      local_e8 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(double *)&f_2);
      kj::_::DebugExpression<double>::operator==
                ((DebugComparison<double,_double_&> *)local_e0,&local_e8,&stack0xffffffffffffffe8);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e0);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<double,double&>&,char_const(&)[39],double&>
                  (&local_f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x6df,FAILED,"U(result) == value",
                   "_kjCondition,\"Value out-of-range for requested type.\", value",
                   (DebugComparison<double,_double_&> *)local_e0,
                   (char (*) [39])"Value out-of-range for requested type.",&stack0xffffffffffffffe8)
        ;
        kj::_::Debug::Fault::~Fault(&local_f8);
      }
      value_local._7_1_ = _kjCondition_2._39_1_;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<double&,double>&,char_const(&)[39],double&>
                ((Fault *)&stack0xffffffffffffff50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x6db,FAILED,"value <= U(MAX)",
                 "_kjCondition,\"Value out-of-range for requested type.\", value",
                 (DebugComparison<double_&,_double> *)local_98,
                 (char (*) [39])"Value out-of-range for requested type.",&stack0xffffffffffffffe8);
      value_local._7_1_ = '\x7f';
      kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff50);
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<double&,double>&,char_const(&)[39],double&>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x6d8,FAILED,"value >= U(MIN)",
               "_kjCondition,\"Value out-of-range for requested type.\", value",
               (DebugComparison<double_&,_double> *)local_48,
               (char (*) [39])"Value out-of-range for requested type.",&stack0xffffffffffffffe8);
    value_local._7_1_ = -0x80;
    kj::_::Debug::Fault::~Fault(&local_60);
  }
  return value_local._7_1_;
}

Assistant:

T checkRoundTripFromFloat(U value) {
  // When `U` is `float` or `double`, we have to use a different approach, because casting an
  // out-of-range float to an integer is, surprisingly, UB.
  constexpr T MIN = kj::minValue;
  constexpr T MAX = kj::maxValue;
  KJ_REQUIRE(value >= U(MIN), "Value out-of-range for requested type.", value) {
    return MIN;
  }
  KJ_REQUIRE(value <= U(MAX), "Value out-of-range for requested type.", value) {
    return MAX;
  }
  T result = value;
  KJ_REQUIRE(U(result) == value, "Value out-of-range for requested type.", value) {
    // Use it anyway.
    break;
  }
  return result;
}